

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsSurfaceGeometry.h
# Opt level: O0

pair<long,_long> __thiscall
anurbs::NurbsSurfaceGeometry<2L>::span_at(NurbsSurfaceGeometry<2L> *this,double u,double v)

{
  int iVar1;
  undefined4 extraout_var;
  Index IVar2;
  undefined4 extraout_var_00;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_a0;
  Index local_78;
  Index span_v;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_60;
  Index local_38;
  Index span_u;
  double v_local;
  double u_local;
  NurbsSurfaceGeometry<2L> *this_local;
  
  span_u = (Index)v;
  v_local = u;
  u_local = (double)this;
  iVar1 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[2])();
  knots_u(&local_60,this);
  IVar2 = Nurbs::
          upper_span<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>>
                    (CONCAT44(extraout_var,iVar1),&local_60,&v_local);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_60);
  local_38 = IVar2;
  iVar1 = (*(this->super_SurfaceBase<2L>)._vptr_SurfaceBase[3])();
  knots_v(&local_a0,this);
  IVar2 = Nurbs::
          upper_span<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>>
                    (CONCAT44(extraout_var_00,iVar1),&local_a0,(double *)&span_u);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_a0);
  local_78 = IVar2;
  std::pair<long,_long>::pair<long,_long,_true>((pair<long,_long> *)&this_local,&local_38,&local_78)
  ;
  return _this_local;
}

Assistant:

std::pair<Index, Index> span_at(const double u, const double v) const
    {
        const auto span_u = Nurbs::upper_span(degree_u(), knots_u(), u);
        const auto span_v = Nurbs::upper_span(degree_v(), knots_v(), v);

        return {span_u, span_v};
    }